

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O2

void __thiscall duckdb::VacuumGlobalSinkState::~VacuumGlobalSinkState(VacuumGlobalSinkState *this)

{
  ~VacuumGlobalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit VacuumGlobalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}